

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_slice.c
# Opt level: O1

int infer_intra(bitstream *str,h264_macroblock *mb,int which)

{
  int iVar1;
  long lVar2;
  int32_t *val;
  
  lVar2 = 0;
  do {
    iVar1 = vs_infer(str,(uint32_t *)((long)mb->ref_idx[(uint)which] + lVar2),0);
    if (iVar1 != 0) {
      return 1;
    }
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x10);
  val = mb->mvd[(uint)which][0] + 1;
  lVar2 = 0x10;
  while( true ) {
    iVar1 = vs_infers(str,(int32_t *)(val + -1),0);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = vs_infers(str,val,0);
    if (iVar1 != 0) break;
    val = val + 2;
    lVar2 = lVar2 + -1;
    if (lVar2 == 0) {
      return 0;
    }
  }
  return 1;
}

Assistant:

static int infer_intra(struct bitstream *str, struct h264_macroblock *mb, int which) {
	int i;
	for (i = 0; i < 4; i++) {
		if (vs_infer(str, &mb->ref_idx[which][i], 0)) return 1;
	}
	for (i = 0; i < 16; i++) {
		if (vs_infers(str, &mb->mvd[which][i][0], 0)) return 1;
		if (vs_infers(str, &mb->mvd[which][i][1], 0)) return 1;
	}
	return 0;
}